

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QUuid qvariant_cast<QUuid>(QVariant *v)

{
  QUuid QVar1;
  bool bVar2;
  QMetaType to;
  QMetaType from;
  QUuid *pQVar3;
  long in_FS_OFFSET;
  QMetaType targetType;
  QUuid t;
  QMetaType in_stack_00000070;
  QMetaType in_stack_00000078;
  QVariant *in_stack_ffffffffffffffa8;
  Private *in_stack_ffffffffffffffb0;
  undefined1 *local_18;
  uchar local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  to = QMetaType::fromType<QUuid>();
  from = QVariant::Private::type(in_stack_ffffffffffffffb0);
  bVar2 = operator==((QMetaType *)in_stack_ffffffffffffffb0,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    pQVar3 = QVariant::Private::get<QUuid>((Private *)0x43e17f);
    local_18 = *(undefined1 **)pQVar3;
    local_10 = *&pQVar3->data4;
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (uchar  [8])&DAT_aaaaaaaaaaaaaaaa;
    QUuid::QUuid((QUuid *)&local_18);
    QVariant::metaType(in_stack_ffffffffffffffa8);
    QVariant::constData((QVariant *)0x43e1cd);
    QMetaType::convert(in_stack_00000078,from.d_ptr,in_stack_00000070,to.d_ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.data4[0] = local_10[0];
    QVar1.data4[1] = local_10[1];
    QVar1.data4[2] = local_10[2];
    QVar1.data4[3] = local_10[3];
    QVar1.data4[4] = local_10[4];
    QVar1.data4[5] = local_10[5];
    QVar1.data4[6] = local_10[6];
    QVar1.data4[7] = local_10[7];
    QVar1._0_8_ = local_18;
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}